

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::RsProdSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind - RsCase < 2) || (kind - RsIfElse < 3)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RsProdSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::RsCase:
        case SyntaxKind::RsCodeBlock:
        case SyntaxKind::RsIfElse:
        case SyntaxKind::RsProdItem:
        case SyntaxKind::RsRepeat:
            return true;
        default:
            return false;
    }
}